

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaft.cpp
# Opt level: O3

void __thiscall chrono::ChShaft::VariablesQbSetSpeed(ChShaft *this,double step)

{
  double dVar1;
  undefined1 auVar2 [16];
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double *local_28;
  long local_20;
  
  dVar1 = this->pos_dt;
  ChVariables::Get_qb((ChVectorRef *)&local_28,&(this->variables).super_ChVariables);
  if (0 < local_20) {
    dVar3 = *local_28;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = dVar3;
    this->pos_dt = dVar3;
    if (this->limitspeed == true) {
      auVar5._0_8_ = (double)this->max_speed;
      auVar5._8_8_ = 0;
      auVar2._8_4_ = 0x80000000;
      auVar2._0_8_ = 0x8000000080000000;
      auVar2._12_4_ = 0x80000000;
      auVar2 = vxorps_avx512vl(ZEXT416((uint)this->max_speed),auVar2);
      auVar4 = vminsd_avx(auVar5,auVar4);
      auVar6._0_8_ = (double)auVar2._0_4_;
      auVar6._8_8_ = auVar2._8_8_;
      if ((auVar5._0_8_ < dVar3) || (auVar4._0_8_ < auVar6._0_8_)) {
        auVar4 = vmaxsd_avx(auVar6,auVar4);
        dVar3 = auVar4._0_8_;
        this->pos_dt = dVar3;
      }
    }
    if ((step != 0.0) || (NAN(step))) {
      this->pos_dtdt = (dVar3 - dVar1) / step;
    }
    return;
  }
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                "Scalar &Eigen::DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double, -1, 1>>, 1>::operator()(Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, Level = 1]"
               );
}

Assistant:

void ChShaft::VariablesQbSetSpeed(double step) {
    double old_dt = pos_dt;

    // from 'qb' vector, sets body speed, and updates auxiliary data
    pos_dt = variables.Get_qb()(0);

    // apply limits (if in speed clamping mode) to speeds.
    ClampSpeed();

    // Compute accel. by BDF (approximate by differentiation);
    if (step) {
        pos_dtdt = (pos_dt - old_dt) / step;
    }
}